

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O2

int slurpfile(char *filename,char *buffer,int buflen)

{
  int __fd;
  ulong uVar1;
  char *__format;
  
  __fd = open(filename,0);
  if (__fd < 0) {
    __format = "open() error on file %s \n";
  }
  else {
    uVar1 = read(__fd,buffer,(long)buflen);
    if (0 < (int)uVar1) {
      if ((int)uVar1 == buflen) {
        printf("slurpfile() read() buffer overflow on file %s",filename);
        uVar1 = (ulong)(buflen - 1);
      }
      buffer[uVar1 & 0xffffffff] = '\0';
      close(__fd);
      return (int)uVar1;
    }
    __format = "read() error on file %s \n";
  }
  printf(__format,filename);
  exit(0);
}

Assistant:

int slurpfile(const char *filename, char *buffer, int buflen)
{
#ifndef _MSC_VER
    int fd, read_len;
    fd = open(filename, O_RDONLY);
    if(fd < 0) {
	printf("open() error on file %s \n", filename); 
	exit(0);
    }
    read_len = read(fd, buffer, buflen);
    if(read_len <= 0) {
	printf("read() error on file %s \n", filename); 
	exit(0);
    }
    if (read_len == buflen) {
	--read_len;
	printf("slurpfile() read() buffer overflow on file %s", filename);
    }
    buffer[read_len] = '\0';
    close(fd);
    return read_len;
#else
    return 0;
#endif
}